

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

time_t Curl_pp_state_timeout(pingpong *pp)

{
  connectdata *pcVar1;
  Curl_easy *pCVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  timediff_t tVar7;
  curltime cVar8;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  long local_78;
  long local_60;
  long response_time;
  time_t timeout2_ms;
  time_t timeout_ms;
  Curl_easy *data;
  connectdata *conn;
  pingpong *pp_local;
  
  pcVar1 = pp->conn;
  pCVar2 = pcVar1->data;
  if ((pCVar2->set).server_response_timeout == 0) {
    local_60 = pp->response_time;
  }
  else {
    local_60 = (pCVar2->set).server_response_timeout;
  }
  cVar8 = Curl_now();
  uVar3 = (pp->response).tv_sec;
  uVar4 = (pp->response).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar8._0_12_,0);
  newer.tv_usec = SUB124(cVar8._0_12_,8);
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  timeout2_ms = local_60 - tVar7;
  if ((pCVar2->set).timeout != 0) {
    local_78 = (pCVar2->set).timeout;
    cVar8 = Curl_now();
    uVar5 = (pcVar1->now).tv_sec;
    uVar6 = (pcVar1->now).tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = SUB128(cVar8._0_12_,0);
    newer_00.tv_usec = SUB124(cVar8._0_12_,8);
    older_00._12_4_ = 0;
    tVar7 = Curl_timediff(newer_00,older_00);
    local_78 = local_78 - tVar7;
    if (timeout2_ms < local_78) {
      local_78 = timeout2_ms;
    }
    timeout2_ms = local_78;
  }
  return timeout2_ms;
}

Assistant:

time_t Curl_pp_state_timeout(struct pingpong *pp)
{
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
  time_t timeout_ms; /* in milliseconds */
  time_t timeout2_ms; /* in milliseconds */
  long response_time = (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_timediff(Curl_now(), pp->response); /* spent time */

  if(data->set.timeout) {
    /* if timeout is requested, find out how much remaining time we have */
    timeout2_ms = data->set.timeout - /* timeout time */
      Curl_timediff(Curl_now(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}